

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setOutputFile(QPDFWriter *this,char *description,FILE *file,bool close_file)

{
  byte bVar1;
  element_type *peVar2;
  element_type *p_00;
  shared_ptr<Pl_StdioFile> local_48;
  undefined1 local_38 [8];
  shared_ptr<Pipeline> p;
  bool close_file_local;
  FILE *file_local;
  char *description_local;
  QPDFWriter *this_local;
  
  p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = close_file;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2->filename = description;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_;
  peVar2->file = file;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2->close_file = (bool)(bVar1 & 1);
  std::make_shared<Pl_StdioFile,char_const(&)[12],_IO_FILE*&>
            ((char (*) [12])&local_48,(_IO_FILE **)"qpdf output");
  std::shared_ptr<Pipeline>::shared_ptr<Pl_StdioFile,void>
            ((shared_ptr<Pipeline> *)local_38,&local_48);
  std::shared_ptr<Pl_StdioFile>::~shared_ptr(&local_48);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::list<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
  push_back(&peVar2->to_delete,(shared_ptr<Pipeline> *)local_38);
  p_00 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  initializePipelineStack(this,p_00);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_38);
  return;
}

Assistant:

void
QPDFWriter::setOutputFile(char const* description, FILE* file, bool close_file)
{
    m->filename = description;
    m->file = file;
    m->close_file = close_file;
    std::shared_ptr<Pipeline> p = std::make_shared<Pl_StdioFile>("qpdf output", file);
    m->to_delete.push_back(p);
    initializePipelineStack(p.get());
}